

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tokenizer.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool include_ignorable;
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  FileInputSource *this;
  BufferInputSource *pBVar5;
  undefined8 extraout_RAX;
  long *plVar6;
  ostream *poVar7;
  char *pcVar8;
  int extraout_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  int i;
  int iVar9;
  Pipeline *pPVar10;
  Pipeline *pPVar11;
  bool bVar12;
  allocator<char> local_162;
  allocator<char> local_161;
  QPDF qpdf;
  size_t local_158;
  shared_ptr<Buffer> content_data;
  Pipeline *local_140;
  Pipeline *local_138;
  shared_ptr<InputSource> is;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  Pl_Buffer plb;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8 [6];
  shared_ptr<Buffer> b;
  __shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  QUtil::setLineBuf(_stdout);
  pcVar8 = *argv;
  pcVar4 = strrchr(pcVar8,0x2f);
  whoami = pcVar4 + 1;
  if (pcVar4 == (char *)0x0) {
    whoami = pcVar8;
  }
  include_ignorable = true;
  local_158 = 0;
  pcVar8 = (char *)0x0;
  for (iVar9 = 1; iVar9 < argc; iVar9 = iVar9 + 1) {
    pcVar4 = argv[iVar9];
    if (*pcVar4 == '-') {
      iVar2 = strcmp(pcVar4,"-maxlen");
      if (iVar2 == 0) {
        iVar9 = iVar9 + 1;
        if (argc <= iVar9) goto LAB_00104d0f;
        uVar3 = QUtil::string_to_uint(argv[iVar9]);
        local_158 = (size_t)uVar3;
      }
      else {
        iVar2 = strcmp(pcVar4,"-no-ignorable");
        if (iVar2 != 0) goto LAB_00104d0f;
        include_ignorable = false;
      }
    }
    else {
      bVar12 = pcVar8 != (char *)0x0;
      pcVar8 = pcVar4;
      if (bVar12) goto LAB_00104d0f;
    }
  }
  if (pcVar8 == (char *)0x0) {
LAB_00104d0f:
    usage();
    QPDF::~QPDF(&qpdf);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&is.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (extraout_EDX != 1) {
      _Unwind_Resume(extraout_RAX);
    }
    plVar6 = (long *)__cxa_begin_catch(extraout_RAX);
    poVar7 = std::operator<<((ostream *)&std::cerr,whoami);
    poVar7 = std::operator<<(poVar7,": exception: ");
    pcVar8 = (char *)(**(code **)(*plVar6 + 0x10))(plVar6);
    std::operator<<(poVar7,pcVar8);
    exit(2);
  }
  is.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  is.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = (FileInputSource *)operator_new(0xd8);
  FileInputSource::FileInputSource(this,pcVar8);
  std::__shared_ptr<InputSource,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<FileInputSource,void>
            ((__shared_ptr<InputSource,(__gnu_cxx::_Lock_policy)2> *)&plb,this);
  std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&is.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> *)&plb);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_f8);
  std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_70,&is.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&plb,"FILE",(allocator<char> *)&local_60);
  dump_tokens((shared_ptr<InputSource> *)&local_70,(string *)&plb,local_158,include_ignorable,true,
              false);
  std::__cxx11::string::~string((string *)&plb);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  QPDF::QPDF(&qpdf);
  QPDF::processFile((char *)&qpdf,pcVar8);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&plb,&qpdf);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&plb);
  pPVar11 = local_138;
  iVar9 = 1;
  for (pPVar10 = local_140; pPVar10 != pPVar11; pPVar10 = pPVar10 + 0x38) {
    Pl_Buffer::Pl_Buffer(&plb,"buffer",(Pipeline *)0x0);
    QPDFPageObjectHelper::pipeContents(pPVar10);
    Pl_Buffer::getBufferSharedPointer();
    pBVar5 = (BufferInputSource *)operator_new(0xe8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"content data",(allocator<char> *)&b);
    BufferInputSource::BufferInputSource
              (pBVar5,(string *)&local_60,
               content_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,false);
    std::__cxx11::string::~string((string *)&local_60);
    std::__shared_ptr<InputSource,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<BufferInputSource,void>
              ((__shared_ptr<InputSource,(__gnu_cxx::_Lock_policy)2> *)&local_60,pBVar5);
    std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&is.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60._M_string_length);
    std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_80,&is.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>);
    QUtil::int_to_string_abi_cxx11_((longlong)&b,iVar9);
    std::operator+(&local_60,"PAGE ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&b);
    dump_tokens((shared_ptr<InputSource> *)&local_80,&local_60,local_158,include_ignorable,false,
                true);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&b);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&content_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Pl_Buffer::~Pl_Buffer(&plb);
    iVar9 = iVar9 + 1;
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_140);
  QPDF::getAllObjects();
  pPVar11 = local_140;
  do {
    if (pPVar11 == local_138) {
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_140);
      QPDF::~QPDF(&qpdf);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&is.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return 0;
    }
    cVar1 = QPDFObjectHandle::isStream();
    if (cVar1 != '\0') {
      QPDFObjectHandle::getDict();
      std::__cxx11::string::string<std::allocator<char>>((string *)&plb,"/Type",&local_161);
      QPDFObjectHandle::getKey((string *)&content_data);
      cVar1 = QPDFObjectHandle::isName();
      if (cVar1 == '\0') {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&content_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        std::__cxx11::string::~string((string *)&plb);
        this_00 = &local_108;
      }
      else {
        QPDFObjectHandle::getDict();
        std::__cxx11::string::string<std::allocator<char>>((string *)&b,"/Type",&local_162);
        QPDFObjectHandle::getKey(local_40);
        QPDFObjectHandle::getName_abi_cxx11_();
        bVar12 = std::operator==(&local_60,"/ObjStm");
        std::__cxx11::string::~string((string *)&local_60);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
        std::__cxx11::string::~string((string *)&b);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&content_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        std::__cxx11::string::~string((string *)&plb);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108);
        if (!bVar12) goto LAB_00104cd4;
        QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&b);
        pBVar5 = (BufferInputSource *)operator_new(0xe8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&plb,"object stream data",(allocator<char> *)&local_60);
        BufferInputSource::BufferInputSource
                  (pBVar5,(string *)&plb,
                   b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,false);
        std::__cxx11::string::~string((string *)&plb);
        std::__shared_ptr<InputSource,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<BufferInputSource,void>
                  ((__shared_ptr<InputSource,(__gnu_cxx::_Lock_policy)2> *)&plb,pBVar5);
        std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&is.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> *)&plb);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_f8);
        std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_a0,&is.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>);
        iVar9 = QPDFObjectHandle::getObjectID();
        QUtil::int_to_string_abi_cxx11_((longlong)&local_60,iVar9);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&plb,
                       "OBJECT STREAM ",&local_60);
        dump_tokens((shared_ptr<InputSource> *)&local_a0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&plb,
                    local_158,include_ignorable,false,false);
        std::__cxx11::string::~string((string *)&plb);
        std::__cxx11::string::~string((string *)&local_60);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
        this_00 = &b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
    }
LAB_00104cd4:
    pPVar11 = pPVar11 + 0x10;
  } while( true );
}

Assistant:

int
main(int argc, char* argv[])
{
    QUtil::setLineBuf(stdout);
    if ((whoami = strrchr(argv[0], '/')) == nullptr) {
        whoami = argv[0];
    } else {
        ++whoami;
    }

    char const* filename = nullptr;
    size_t max_len = 0;
    bool include_ignorable = true;
    for (int i = 1; i < argc; ++i) {
        if (argv[i][0] == '-') {
            if (strcmp(argv[i], "-maxlen") == 0) {
                if (++i >= argc) {
                    usage();
                }
                max_len = QUtil::string_to_uint(argv[i]);
            } else if (strcmp(argv[i], "-no-ignorable") == 0) {
                include_ignorable = false;
            } else {
                usage();
            }
        } else if (filename) {
            usage();
        } else {
            filename = argv[i];
        }
    }
    if (filename == nullptr) {
        usage();
    }

    try {
        process(filename, include_ignorable, max_len);
    } catch (std::exception& e) {
        std::cerr << whoami << ": exception: " << e.what();
        exit(2);
    }
    return 0;
}